

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O3

tsize_t MyRead(thandle_t opaque,void *dst,tsize_t size)

{
  long lVar1;
  size_t __n;
  
  lVar1 = *(long *)((long)opaque + 0x10);
  __n = *(ulong *)((long)opaque + 8) - lVar1;
  if ((ulong)(lVar1 + size) <= *(ulong *)((long)opaque + 8)) {
    __n = size;
  }
  if (0 < (long)__n) {
    memcpy(dst,(void *)(lVar1 + *opaque),__n);
    *(long *)((long)opaque + 0x10) = *(long *)((long)opaque + 0x10) + __n;
  }
  return __n;
}

Assistant:

static tsize_t MyRead(thandle_t opaque, void* dst, tsize_t size) {
  MyData* const my_data = (MyData*)opaque;
  if (my_data->pos + size > my_data->size) {
    size = (tsize_t)(my_data->size - my_data->pos);
  }
  if (size > 0) {
    memcpy(dst, my_data->data + my_data->pos, size);
    my_data->pos += size;
  }
  return size;
}